

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O3

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  ulong uVar1;
  const_pointer local_20;
  const_pointer local_18;
  const_pointer local_10 [2];
  
  while( true ) {
    uVar1 = this->size_;
    if (uVar1 == 0) {
      return 0xffffffffffffffff;
    }
    if (pos < uVar1) break;
    pos = uVar1 - 1;
  }
  local_18 = this->data_;
  local_10[0] = local_18 + pos + 1;
  std::
  __find_if<std::reverse_iterator<char_const*>,__gnu_cxx::__ops::_Iter_pred<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>::not_in_view>>
            (&local_20,local_10,&local_18,v.data_,v.size_);
  if (local_20 == this->data_) {
    return 0xffffffffffffffff;
  }
  return (size_type)(local_20 + ~(ulong)this->data_);
}

Assistant:

bool empty() const nssv_noexcept
    {
        return 0 == size_;
    }